

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void FASTCOVER_tryParameters(void *opaque)

{
  byte bVar1;
  FASTCOVER_ctx_t *ctx;
  size_t __size;
  COVER_dictSelection_t selection;
  ZDICT_cover_params_t params;
  ZDICT_cover_params_t parameters_00;
  U16 *segmentFreqs;
  void *dictBuffer;
  U32 *freqs;
  size_t sVar2;
  BYTE *__ptr;
  size_t __size_00;
  size_t in_stack_ffffffffffffff48;
  COVER_dictSelection_t ds;
  ZDICT_cover_params_t parameters;
  
  ctx = *opaque;
  parameters_00 = *(ZDICT_cover_params_t *)((long)opaque + 0x18);
  params = *(ZDICT_cover_params_t *)((long)opaque + 0x18);
  __size = *(size_t *)((long)opaque + 0x10);
  bVar1 = (byte)ctx->f;
  segmentFreqs = (U16 *)calloc(1L << (bVar1 & 0x3f),2);
  dictBuffer = malloc(__size);
  ds.dictContent = (BYTE *)0x0;
  ds.dictSize = 0;
  ds.totalCompressedSize = 0xffffffffffffffff;
  __size_00 = 4L << (bVar1 & 0x3f);
  freqs = (U32 *)malloc(__size_00);
  if ((dictBuffer == (void *)0x0 || segmentFreqs == (U16 *)0x0) || freqs == (U32 *)0x0) {
    if (g_displayLevel < 1) {
      __ptr = (BYTE *)0x0;
      goto LAB_001b16bd;
    }
    fwrite("Failed to allocate buffers: out of memory\n",0x2a,1,_stderr);
    __ptr = (BYTE *)0x0;
  }
  else {
    memcpy(freqs,ctx->freqs,__size_00);
    sVar2 = FASTCOVER_buildDictionary
                      (ctx,freqs,dictBuffer,__size,*(ZDICT_cover_params_t *)((long)opaque + 0x18),
                       segmentFreqs);
    COVER_selectDict(&ds,(BYTE *)((long)dictBuffer + sVar2),__size,__size - sVar2,ctx->samples,
                     ctx->samplesSizes,
                     (uint)(((ulong)(ctx->accelParams).finalize * ctx->nbTrainSamples) / 100),
                     ctx->nbTrainSamples,ctx->nbSamples,params,ctx->offsets,
                     in_stack_ffffffffffffff48);
    __ptr = ds.dictContent;
    if ((ds.dictContent != (BYTE *)0x0 && ds.totalCompressedSize < 0xffffffffffffff89) ||
       (g_displayLevel < 1)) goto LAB_001b16bd;
    fwrite("Failed to select dictionary\n",0x1c,1,_stderr);
  }
  fflush(_stderr);
LAB_001b16bd:
  free(dictBuffer);
  selection.dictSize = ds.dictSize;
  selection.dictContent = ds.dictContent;
  selection.totalCompressedSize = ds.totalCompressedSize;
  COVER_best_finish(*(COVER_best_t **)((long)opaque + 8),parameters_00,selection);
  free(opaque);
  free(segmentFreqs);
  free(__ptr);
  free(freqs);
  return;
}

Assistant:

static void FASTCOVER_tryParameters(void* opaque)
{
  /* Save parameters as local variables */
  FASTCOVER_tryParameters_data_t *const data = (FASTCOVER_tryParameters_data_t*)opaque;
  const FASTCOVER_ctx_t *const ctx = data->ctx;
  const ZDICT_cover_params_t parameters = data->parameters;
  size_t dictBufferCapacity = data->dictBufferCapacity;
  size_t totalCompressedSize = ERROR(GENERIC);
  /* Initialize array to keep track of frequency of dmer within activeSegment */
  U16* segmentFreqs = (U16*)calloc(((U64)1 << ctx->f), sizeof(U16));
  /* Allocate space for hash table, dict, and freqs */
  BYTE *const dict = (BYTE*)malloc(dictBufferCapacity);
  COVER_dictSelection_t selection = COVER_dictSelectionError(ERROR(GENERIC));
  U32* freqs = (U32*) malloc(((U64)1 << ctx->f) * sizeof(U32));
  if (!segmentFreqs || !dict || !freqs) {
    DISPLAYLEVEL(1, "Failed to allocate buffers: out of memory\n");
    goto _cleanup;
  }
  /* Copy the frequencies because we need to modify them */
  memcpy(freqs, ctx->freqs, ((U64)1 << ctx->f) * sizeof(U32));
  /* Build the dictionary */
  { const size_t tail = FASTCOVER_buildDictionary(ctx, freqs, dict, dictBufferCapacity,
                                                    parameters, segmentFreqs);

    const unsigned nbFinalizeSamples = (unsigned)(ctx->nbTrainSamples * ctx->accelParams.finalize / 100);
    selection = COVER_selectDict(dict + tail, dictBufferCapacity, dictBufferCapacity - tail,
         ctx->samples, ctx->samplesSizes, nbFinalizeSamples, ctx->nbTrainSamples, ctx->nbSamples, parameters, ctx->offsets,
         totalCompressedSize);

    if (COVER_dictSelectionIsError(selection)) {
      DISPLAYLEVEL(1, "Failed to select dictionary\n");
      goto _cleanup;
    }
  }
_cleanup:
  free(dict);
  COVER_best_finish(data->best, parameters, selection);
  free(data);
  free(segmentFreqs);
  COVER_dictSelectionFree(selection);
  free(freqs);
}